

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

Vector * operator/(Vector *__return_storage_ptr__,Vector *l,double lambda)

{
  operator*(__return_storage_ptr__,l,1.0 / lambda);
  return __return_storage_ptr__;
}

Assistant:

Vector operator/(const Vector& l, double lambda)
{
	return l * (1 / lambda);
}